

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleFunctionalTests.cpp
# Opt level: O0

void __thiscall
glcts::MultisampleTextureFunctionalTestsSampleMaskingTexturesTest::initInternals
          (MultisampleTextureFunctionalTestsSampleMaskingTexturesTest *this)

{
  int iVar1;
  deUint32 dVar2;
  GLuint GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *pTVar6;
  Functions *gl;
  MultisampleTextureFunctionalTestsSampleMaskingTexturesTest *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar5 + 0x6f8))(1,&this->to_2d_multisample_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGenTextures() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0x796);
  if (this->to_2d_multisample_id == 0) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"Texture object has not been generated properly",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
               ,0x79a);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lVar5 + 0x6c8))(1,&this->bo_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGenBuffers() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0x7a0);
  if (this->bo_id == 0) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"Buffer object has not been generated properly",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
               ,0x7a4);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lVar5 + 0x6d0))(1,&this->fbo_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGenFramebuffers() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0x7aa);
  if (this->fbo_id == 0) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"Framebuffer object has not been generated properly",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
               ,0x7ae);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lVar5 + 0x700))(1,&this->tfo_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGenTransformFeedbacks() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0x7b4);
  if (this->tfo_id == 0) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"Transform feedback object has not been generated properly",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
               ,0x7b8);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
  this->vs_draw_id = GVar3;
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glCreateShader() call failed for vs_draw_id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0x7be);
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
  this->vs_verify_id = GVar3;
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glCreateShader() call failed for vs_verify_id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0x7c3);
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
  this->fs_draw_id = GVar3;
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glCreateShader() call failed for fs_draw_id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0x7c8);
  GVar3 = (**(code **)(lVar5 + 0x3c8))();
  this->po_draw_id = GVar3;
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glCreateProgram() call failed for po_draw_id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0x7cd);
  GVar3 = (**(code **)(lVar5 + 0x3c8))();
  this->po_verify_id = GVar3;
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glCreateProgram() call failed for po_verify_id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0x7d2);
  return;
}

Assistant:

void MultisampleTextureFunctionalTestsSampleMaskingTexturesTest::initInternals()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate a 2D multisample texture object of id to_2d_multisample_id */
	gl.genTextures(1, &to_2d_multisample_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed");

	if (to_2d_multisample_id == 0)
	{
		TCU_FAIL("Texture object has not been generated properly");
	}

	/* Generate a buffer object of id bo_id */
	gl.genBuffers(1, &bo_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed");

	if (bo_id == 0)
	{
		TCU_FAIL("Buffer object has not been generated properly");
	}

	/* Generate a framebuffer object of id fbo_id */
	gl.genFramebuffers(1, &fbo_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() call failed");

	if (fbo_id == 0)
	{
		TCU_FAIL("Framebuffer object has not been generated properly");
	}

	/* Generate a transform feedback object of id tfo_id */
	gl.genTransformFeedbacks(1, &tfo_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTransformFeedbacks() call failed");

	if (tfo_id == 0)
	{
		TCU_FAIL("Transform feedback object has not been generated properly");
	}

	/* Create a vertex shader vs_draw_id */
	vs_draw_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed for vs_draw_id");

	/* Create a vertex shader vs_verify_id */
	vs_verify_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed for vs_verify_id");

	/* Create a fragment shader fs_draw_id */
	fs_draw_id = gl.createShader(GL_FRAGMENT_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed for fs_draw_id");

	/* Create program objects po_draw_id */
	po_draw_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed for po_draw_id");

	/* Create program objects po_verify_id */
	po_verify_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed for po_verify_id");
}